

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.c
# Opt level: O0

MUSTACHE_TEMPLATE *
mustache_compile(char *templ_data,size_t templ_size,MUSTACHE_PARSER *parser,void *parser_data,
                uint flags)

{
  int iVar1;
  ulong num;
  MUSTACHE_PARSER *in_RDX;
  long in_RDI;
  size_t indent_len;
  int success;
  int done;
  MUSTACHE_STACK jmp_pos_stack;
  MUSTACHE_BUFFER insns;
  MUSTACHE_TAGINFO *tag;
  off_t jmp_pos;
  off_t off;
  uint n_tags;
  MUSTACHE_TAGINFO *tags;
  void *in_stack_ffffffffffffff48;
  uint7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  size_t in_stack_ffffffffffffff68;
  int iVar2;
  int iVar3;
  MUSTACHE_BUFFER *in_stack_ffffffffffffff78;
  MUSTACHE_TEMPLATE *local_70 [3];
  uint *local_58;
  uintptr_t local_50;
  long local_48;
  uint *local_38;
  MUSTACHE_PARSER *local_20;
  long local_10;
  MUSTACHE_TEMPLATE *local_8;
  
  local_38 = (uint *)0x0;
  local_20 = in_RDX;
  local_10 = in_RDI;
  memset(local_70,0,0x18);
  memset(&stack0xffffffffffffff78,0,0x18);
  iVar3 = 0;
  iVar2 = 0;
  if (local_20 == (MUSTACHE_PARSER *)0x0) {
    local_20 = &mustache_compile::default_parser;
  }
  iVar1 = mustache_parse((char *)insns.alloc,insns.n,(MUSTACHE_PARSER *)insns.data,
                         (void *)jmp_pos_stack.alloc,(MUSTACHE_TAGINFO **)jmp_pos_stack.n,
                         (uint *)jmp_pos_stack.data);
  if (iVar1 == 0) {
    local_48 = 0;
    local_58 = local_38;
    do {
      if (local_48 < *(long *)(local_58 + 6)) {
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if (((iVar1 != 0) ||
            (iVar1 = mustache_buffer_append_num
                               ((MUSTACHE_BUFFER *)
                                CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                (uint64_t)in_stack_ffffffffffffff48), iVar1 != 0)) ||
           (iVar1 = mustache_buffer_append
                              ((MUSTACHE_BUFFER *)
                               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48,0x1091b7), iVar1 != 0)) break;
        local_48 = *(long *)(local_58 + 6);
      }
      num = (ulong)*local_58;
      switch(num) {
      case 0:
        iVar3 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if (iVar3 == 0) {
          iVar3 = 1;
          goto LAB_0010965f;
        }
        goto LAB_00109691;
      default:
        goto LAB_0010965f;
      case 3:
      case 4:
      case 5:
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if ((iVar1 != 0) ||
           (iVar1 = mustache_compile_tagname
                              (in_stack_ffffffffffffff78,(char *)CONCAT44(iVar3,iVar2),
                               in_stack_ffffffffffffff68), iVar1 != 0)) goto LAB_00109691;
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        break;
      case 6:
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if (((iVar1 != 0) ||
            (iVar1 = mustache_stack_push((MUSTACHE_STACK *)
                                         CONCAT17(in_stack_ffffffffffffff57,
                                                  in_stack_ffffffffffffff50),
                                         (uintptr_t)in_stack_ffffffffffffff48), iVar1 != 0)) ||
           ((iVar1 = mustache_compile_tagname
                               (in_stack_ffffffffffffff78,(char *)CONCAT44(iVar3,iVar2),
                                in_stack_ffffffffffffff68), iVar1 != 0 ||
            (iVar1 = mustache_buffer_append_num
                               ((MUSTACHE_BUFFER *)
                                CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                (uint64_t)in_stack_ffffffffffffff48), iVar1 != 0))))
        goto LAB_00109691;
        iVar1 = mustache_stack_push((MUSTACHE_STACK *)
                                    CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                    (uintptr_t)in_stack_ffffffffffffff48);
        break;
      case 7:
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if (((iVar1 != 0) ||
            (iVar1 = mustache_stack_push((MUSTACHE_STACK *)
                                         CONCAT17(in_stack_ffffffffffffff57,
                                                  in_stack_ffffffffffffff50),
                                         (uintptr_t)in_stack_ffffffffffffff48), iVar1 != 0)) ||
           (iVar1 = mustache_compile_tagname
                              (in_stack_ffffffffffffff78,(char *)CONCAT44(iVar3,iVar2),
                               in_stack_ffffffffffffff68), iVar1 != 0)) goto LAB_00109691;
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        break;
      case 8:
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if (iVar1 != 0) goto LAB_00109691;
        mustache_stack_pop((MUSTACHE_STACK *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if (iVar1 != 0) goto LAB_00109691;
        local_50 = mustache_stack_pop((MUSTACHE_STACK *)
                                      CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
        ;
        iVar1 = mustache_buffer_insert_num
                          ((MUSTACHE_BUFFER *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffff68,num);
        break;
      case 9:
        local_50 = mustache_stack_pop((MUSTACHE_STACK *)
                                      CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
        ;
        iVar1 = mustache_buffer_insert_num
                          ((MUSTACHE_BUFFER *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffff68,num);
        break;
      case 10:
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
        if (((iVar1 != 0) ||
            (iVar1 = mustache_buffer_append_num
                               ((MUSTACHE_BUFFER *)
                                CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                (uint64_t)in_stack_ffffffffffffff48), iVar1 != 0)) ||
           (iVar1 = mustache_buffer_append
                              ((MUSTACHE_BUFFER *)
                               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48,0x10950f), iVar1 != 0)) goto LAB_00109691;
        in_stack_ffffffffffffff68 = 0;
        while( true ) {
          in_stack_ffffffffffffff57 = true;
          if (((*(char *)(local_10 + *(long *)(local_58 + 6) + in_stack_ffffffffffffff68) != ' ') &&
              (in_stack_ffffffffffffff57 = true,
              *(char *)(local_10 + *(long *)(local_58 + 6) + in_stack_ffffffffffffff68) != '\t')) &&
             (in_stack_ffffffffffffff57 = true,
             *(char *)(local_10 + *(long *)(local_58 + 6) + in_stack_ffffffffffffff68) != '\v')) {
            in_stack_ffffffffffffff57 =
                 *(char *)(local_10 + *(long *)(local_58 + 6) + in_stack_ffffffffffffff68) == '\f';
          }
          if ((bool)in_stack_ffffffffffffff57 == false) break;
          in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 + 1;
        }
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)(ulong)in_stack_ffffffffffffff50,
                           (uint64_t)in_stack_ffffffffffffff48);
        if (iVar1 != 0) goto LAB_00109691;
        iVar1 = mustache_buffer_append
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48,0x109613);
        break;
      case 0xb:
        iVar1 = mustache_buffer_append_num
                          ((MUSTACHE_BUFFER *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48);
      }
      if (iVar1 != 0) break;
LAB_0010965f:
      if (iVar3 != 0) goto LAB_00109689;
      local_48 = *(long *)(local_58 + 8);
      local_58 = local_58 + 0xe;
    } while( true );
  }
LAB_00109691:
  free(local_38);
  mustache_buffer_free((MUSTACHE_BUFFER *)0x1096a8);
  if (iVar2 == 0) {
    mustache_buffer_free((MUSTACHE_BUFFER *)0x1096c8);
    local_8 = (MUSTACHE_TEMPLATE *)0x0;
  }
  else {
    local_8 = local_70[0];
  }
  return local_8;
LAB_00109689:
  iVar2 = 1;
  goto LAB_00109691;
}

Assistant:

MUSTACHE_TEMPLATE*
mustache_compile(const char* templ_data, size_t templ_size,
                 const MUSTACHE_PARSER* parser, void* parser_data,
                 unsigned flags)
{
    static const MUSTACHE_PARSER default_parser = { mustache_parse_error };
    MUSTACHE_TAGINFO* tags = NULL;
    unsigned n_tags;
    off_t off;
    off_t jmp_pos;
    MUSTACHE_TAGINFO* tag;
    MUSTACHE_BUFFER insns = { 0 };
    MUSTACHE_STACK jmp_pos_stack = { 0 };
    int done = 0;
    int success = 0;
    size_t indent_len;

    if(parser == NULL)
        parser = &default_parser;

    /* Collect all tags from the template. */
    if(mustache_parse(templ_data, templ_size, parser, parser_data, &tags, &n_tags) != 0)
        goto err;

    /* Build the template */
#define APPEND(data, n)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append(&insns, (data), (n)) != 0)                        \
                goto err;                                                               \
        } while(0)

#define APPEND_NUM(num)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append_num(&insns, (uint64_t)(num)) != 0)                \
                goto err;                                                               \
        } while(0)

#define APPEND_TAGNAME(tag)                                                             \
        do {                                                                            \
            if(mustache_compile_tagname(&insns, templ_data + (tag)->name_beg,           \
                                        (tag)->name_end - (tag)->name_beg) != 0)        \
                goto err;                                                               \
        } while(0)

#define INSERT_NUM(pos, num)                                                            \
        do {                                                                            \
            if(mustache_buffer_insert_num(&insns, (pos), (uint64_t)(num)) != 0)         \
                goto err;                                                               \
        } while(0)

#define PUSH_JMP_POS()                                                                  \
        do {                                                                            \
            if(mustache_stack_push(&jmp_pos_stack, insns.n) != 0)                       \
                goto err;                                                               \
        } while(0)

#define POP_JMP_POS()       ((off_t) mustache_stack_pop(&jmp_pos_stack))

    off = 0;
    tag = &tags[0];
    while(1) {
        if(off < tag->beg) {
            /* Handle literal text before the next tag. */
            APPEND_NUM(MUSTACHE_OP_LITERAL);
            APPEND_NUM(tag->beg - off);
            APPEND(templ_data + off, tag->beg - off);
            off = tag->beg;
        }

        switch(tag->type) {
        case MUSTACHE_TAGTYPE_VAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR2:
            APPEND_NUM(MUSTACHE_OP_RESOLVE);
            APPEND_TAGNAME(tag);
            APPEND_NUM((tag->type == MUSTACHE_TAGTYPE_VAR) ?
                        MUSTACHE_OP_OUTESCAPED : MUSTACHE_OP_OUTVERBATIM);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTION:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTER);
            PUSH_JMP_POS();
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTION:
            APPEND_NUM(MUSTACHE_OP_LEAVE);
            APPEND_NUM(insns.n - POP_JMP_POS());
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTIONINV:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTERINV);
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTIONINV:
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_PARTIAL:
            APPEND_NUM(MUSTACHE_OP_PARTIAL);
            APPEND_NUM(tag->name_end - tag->name_beg);
            APPEND(templ_data + tag->name_beg, tag->name_end - tag->name_beg);
            indent_len = 0;
            while(MUSTACHE_ISWHITESPACE(templ_data[tag->beg + indent_len]))
                indent_len++;
            APPEND_NUM(indent_len);
            APPEND(templ_data + tag->beg, indent_len);
            break;

        case MUSTACHE_TAGTYPE_INDENT:
            APPEND_NUM(MUSTACHE_OP_INDENT);
            break;

        case MUSTACHE_TAGTYPE_NONE:
            APPEND_NUM(MUSTACHE_OP_EXIT);
            done = 1;
            break;

        default:
            break;
        }

        if(done)
            break;

        off = tag->end;
        tag++;
    }

    success = 1;

err:
    free(tags);
    mustache_buffer_free(&jmp_pos_stack);
    if(success) {
        return (MUSTACHE_TEMPLATE*) insns.data;
    } else {
        mustache_buffer_free(&insns);
        return NULL;
    }
}